

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CECoordinates.cpp
# Opt level: O0

int CECoordinates::Observed2Galactic
              (double az,double zen,double *glon,double *glat,CEDate *date,CEObserver *observer,
              CEAngleType *angle_type)

{
  int iVar1;
  CEObserver *in_RCX;
  long *in_RDX;
  double *in_RSI;
  double *in_RDI;
  int *in_R8;
  double in_XMM0_Qa;
  double elevation_m;
  double latitude;
  double longitude;
  double julian_date;
  double *glat_00;
  double *glon_00;
  double zen_00;
  double az_00;
  double relative_humidity;
  int err_code;
  double *temperature_celsius;
  double *pressure_hPa;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  undefined8 local_8;
  
  local_8 = in_XMM0_Qa;
  if (*in_R8 == 0) {
    local_8 = in_XMM0_Qa * 0.017453292519943295;
  }
  temperature_celsius = in_RDI;
  pressure_hPa = in_RSI;
  elevation_m = (double)(**(code **)(*in_RDX + 0x20))();
  latitude = CEObserver::Longitude_Rad(in_RCX);
  longitude = CEObserver::Latitude_Rad(in_RCX);
  julian_date = CEObserver::Elevation_m(in_RCX);
  glat_00 = (double *)CEObserver::Pressure_hPa(in_RCX);
  glon_00 = (double *)CEObserver::Temperature_C(in_RCX);
  zen_00 = CEObserver::RelativeHumidity(in_RCX);
  az_00 = CEDate::dut1((CEDate *)0x128230);
  CEDate::xpolar((CEDate *)0x128243);
  relative_humidity = CEDate::ypolar((CEDate *)0x128259);
  CEObserver::Wavelength_um(in_RCX);
  iVar1 = Observed2Galactic(az_00,zen_00,glon_00,glat_00,julian_date,longitude,latitude,elevation_m,
                            (double)pressure_hPa,(double)temperature_celsius,relative_humidity,
                            local_8,(double)CONCAT44(in_stack_ffffffffffffffc4,
                                                     in_stack_ffffffffffffffc0),(double)in_R8,
                            (double)in_RCX);
  if (*in_R8 == 0) {
    *in_RDI = *in_RDI * 57.29577951308232;
    *in_RSI = *in_RSI * 57.29577951308232;
  }
  return iVar1;
}

Assistant:

int CECoordinates::Observed2Galactic(double az, double zen,
                                 double *glon, double *glat,
                                 const CEDate&     date,
                                 const CEObserver& observer,
                                 const CEAngleType& angle_type)
{
    // Convert to radians if necessary
    if (angle_type == CEAngleType::DEGREES) {
        az *= DD2R ;
        zen *= DD2R ;
    }
    
    // Call the raw method
    int err_code = Observed2Galactic(az, zen, glon, glat, date.JD(),
                  observer.Longitude_Rad(), observer.Latitude_Rad(),
                  observer.Elevation_m(),
                  observer.Pressure_hPa(), observer.Temperature_C(),
                  observer.RelativeHumidity(),
                  date.dut1(),
                  date.xpolar(), date.ypolar(),
                  observer.Wavelength_um()) ;
    
    // Convert back to degrees if necessary
    if (angle_type == CEAngleType::DEGREES) {
        *glon *= DR2D ;
        *glat *= DR2D ;
    }
    
    return err_code ;
}